

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

void __thiscall Json::StyledWriter::writeCommentAfterValueOnSameLine(StyledWriter *this,Value *root)

{
  bool bVar1;
  long *plVar2;
  size_type *psVar3;
  string *psVar4;
  string local_78;
  string local_58;
  string local_38;
  
  bVar1 = Value::hasComment(root,commentAfterOnSameLine);
  if (bVar1) {
    Value::getComment_abi_cxx11_(&local_38,root,commentAfterOnSameLine);
    normalizeEOL(&local_58,&local_38);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x574e75);
    psVar3 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_78.field_2._M_allocated_capacity = *psVar3;
      local_78.field_2._8_8_ = plVar2[3];
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    }
    else {
      local_78.field_2._M_allocated_capacity = *psVar3;
      local_78._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_78._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_78._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  bVar1 = Value::hasComment(root,commentAfter);
  if (bVar1) {
    psVar4 = &this->document_;
    std::__cxx11::string::append((char *)psVar4);
    Value::getComment_abi_cxx11_(&local_58,root,commentAfter);
    normalizeEOL(&local_78,&local_58);
    std::__cxx11::string::_M_append((char *)psVar4,(ulong)local_78._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)psVar4);
  }
  return;
}

Assistant:

void StyledWriter::writeCommentAfterValueOnSameLine(const Value& root) {
  if (root.hasComment(commentAfterOnSameLine))
    document_ += " " + normalizeEOL(root.getComment(commentAfterOnSameLine));

  if (root.hasComment(commentAfter)) {
    document_ += "\n";
    document_ += normalizeEOL(root.getComment(commentAfter));
    document_ += "\n";
  }
}